

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_f64.c
# Opt level: O0

void bashF0(u64 *s)

{
  u64 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  u64 t2;
  u64 t1;
  u64 t0;
  u64 *s_local;
  
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x35 | *s >> 0xb);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x33 | s[1] >> 0xd);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 0x25 | s[2] >> 0x1b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 3 | s[3] >> 0x3d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x15 | s[4] >> 0x2b);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x13 | s[5] >> 0x2d);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 5 | s[6] >> 0x3b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 0x23 | s[7] >> 0x1d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  s[1] = s[1] ^ 0x3bf5080ac8ba94b1;
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x35 | s[0xf] >> 0xb);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x33 | s[10] >> 0xd);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 0x25 | s[9] >> 0x1b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 3 | s[0xc] >> 0x3d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x15 | s[0xb] >> 0x2b);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x13 | s[0xe] >> 0x2d);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 5 | s[0xd] >> 0x3b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 0x23 | s[8] >> 0x1d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  s[10] = s[10] ^ 0xc1d1659c1bbd92f6;
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x35 | s[0x16] >> 0xb);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x33 | s[0x13] >> 0xd);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 0x25 | s[0x10] >> 0x1b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 3 | s[0x15] >> 0x3d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x15 | s[0x12] >> 0x2b);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x13 | s[0x17] >> 0x2d);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 5 | s[0x14] >> 0x3b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 0x23 | s[0x11] >> 0x1d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  s[0x13] = s[0x13] ^ 0x60e8b2ce0ddec97b;
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x35 | s[4] >> 0xb);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x33 | s[5] >> 0xd);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 0x25 | s[6] >> 0x1b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 3 | s[7] >> 0x3d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x15 | *s >> 0x2b);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x13 | s[1] >> 0x2d);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 5 | s[2] >> 0x3b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 0x23 | s[3] >> 0x1d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  s[5] = s[5] ^ 0xec5fb8fe790fbc13;
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x35 | s[0xb] >> 0xb);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x33 | s[0xe] >> 0xd);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 0x25 | s[0xd] >> 0x1b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 3 | s[8] >> 0x3d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x15 | s[0xf] >> 0x2b);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x13 | s[10] >> 0x2d);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 5 | s[9] >> 0x3b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 0x23 | s[0xc] >> 0x1d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  s[0xe] = s[0xe] ^ 0xaa043de6436706a7;
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x35 | s[0x12] >> 0xb);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x33 | s[0x17] >> 0xd);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 0x25 | s[0x14] >> 0x1b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 3 | s[0x11] >> 0x3d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x15 | s[0x16] >> 0x2b);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x13 | s[0x13] >> 0x2d);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 5 | s[0x10] >> 0x3b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 0x23 | s[0x15] >> 0x1d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  s[0x17] = s[0x17] ^ 0x8929ff6a5e535bfd;
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x35 | *s >> 0xb);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x33 | s[1] >> 0xd);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 0x25 | s[2] >> 0x1b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 3 | s[3] >> 0x3d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x15 | s[4] >> 0x2b);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x13 | s[5] >> 0x2d);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 5 | s[6] >> 0x3b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 0x23 | s[7] >> 0x1d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  s[1] = s[1] ^ 0x98bf1e2c50c97550;
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x35 | s[0xf] >> 0xb);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x33 | s[10] >> 0xd);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 0x25 | s[9] >> 0x1b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 3 | s[0xc] >> 0x3d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x15 | s[0xb] >> 0x2b);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x13 | s[0xe] >> 0x2d);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 5 | s[0xd] >> 0x3b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 0x23 | s[8] >> 0x1d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  s[10] = s[10] ^ 0x4c5f8f162864baa8;
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x35 | s[0x16] >> 0xb);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x33 | s[0x13] >> 0xd);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 0x25 | s[0x10] >> 0x1b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 3 | s[0x15] >> 0x3d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x15 | s[0x12] >> 0x2b);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x13 | s[0x17] >> 0x2d);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 5 | s[0x14] >> 0x3b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 0x23 | s[0x11] >> 0x1d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  s[0x13] = s[0x13] ^ 0x262fc78b14325d54;
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x35 | s[4] >> 0xb);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x33 | s[5] >> 0xd);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 0x25 | s[6] >> 0x1b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 3 | s[7] >> 0x3d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x15 | *s >> 0x2b);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x13 | s[1] >> 0x2d);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 5 | s[2] >> 0x3b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 0x23 | s[3] >> 0x1d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  s[5] = s[5] ^ 0x1317e3c58a192eaa;
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x35 | s[0xb] >> 0xb);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x33 | s[0xe] >> 0xd);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 0x25 | s[0xd] >> 0x1b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 3 | s[8] >> 0x3d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x15 | s[0xf] >> 0x2b);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x13 | s[10] >> 0x2d);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 5 | s[9] >> 0x3b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 0x23 | s[0xc] >> 0x1d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  s[0xe] = s[0xe] ^ 0x98bf1e2c50c9755;
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x35 | s[0x12] >> 0xb);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x33 | s[0x17] >> 0xd);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 0x25 | s[0x14] >> 0x1b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 3 | s[0x11] >> 0x3d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x15 | s[0x16] >> 0x2b);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x13 | s[0x13] >> 0x2d);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 5 | s[0x10] >> 0x3b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 0x23 | s[0x15] >> 0x1d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  s[0x17] = s[0x17] ^ 0xd8ee19681d669304;
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x35 | *s >> 0xb);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x33 | s[1] >> 0xd);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 0x25 | s[2] >> 0x1b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 3 | s[3] >> 0x3d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x15 | s[4] >> 0x2b);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x13 | s[5] >> 0x2d);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 5 | s[6] >> 0x3b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 0x23 | s[7] >> 0x1d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  s[1] = s[1] ^ 0x6c770cb40eb34982;
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x35 | s[0xf] >> 0xb);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x33 | s[10] >> 0xd);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 0x25 | s[9] >> 0x1b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 3 | s[0xc] >> 0x3d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x15 | s[0xb] >> 0x2b);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x13 | s[0xe] >> 0x2d);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 5 | s[0xd] >> 0x3b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 0x23 | s[8] >> 0x1d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  s[10] = s[10] ^ 0x363b865a0759a4c1;
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x35 | s[0x16] >> 0xb);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x33 | s[0x13] >> 0xd);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 0x25 | s[0x10] >> 0x1b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 3 | s[0x15] >> 0x3d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x15 | s[0x12] >> 0x2b);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x13 | s[0x17] >> 0x2d);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 5 | s[0x14] >> 0x3b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 0x23 | s[0x11] >> 0x1d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  s[0x13] = s[0x13] ^ 0xc73622b47c4c0ace;
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x35 | s[4] >> 0xb);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x33 | s[5] >> 0xd);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 0x25 | s[6] >> 0x1b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 3 | s[7] >> 0x3d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x15 | *s >> 0x2b);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x13 | s[1] >> 0x2d);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 5 | s[2] >> 0x3b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 0x23 | s[3] >> 0x1d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  s[5] = s[5] ^ 0x639b115a3e260567;
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x35 | s[0xb] >> 0xb);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x33 | s[0xe] >> 0xd);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 0x25 | s[0xd] >> 0x1b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 3 | s[8] >> 0x3d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x15 | s[0xf] >> 0x2b);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x13 | s[10] >> 0x2d);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 5 | s[9] >> 0x3b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 0x23 | s[0xc] >> 0x1d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  s[0xe] = s[0xe] ^ 0xede6693460f3da1d;
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x35 | s[0x12] >> 0xb);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x33 | s[0x17] >> 0xd);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 0x25 | s[0x14] >> 0x1b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 3 | s[0x11] >> 0x3d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x15 | s[0x16] >> 0x2b);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x13 | s[0x13] >> 0x2d);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 5 | s[0x10] >> 0x3b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 0x23 | s[0x15] >> 0x1d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  s[0x17] = s[0x17] ^ 0xaad8d5034f9935a0;
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x35 | *s >> 0xb);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x33 | s[1] >> 0xd);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 0x25 | s[2] >> 0x1b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 3 | s[3] >> 0x3d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x15 | s[4] >> 0x2b);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x13 | s[5] >> 0x2d);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 5 | s[6] >> 0x3b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 0x23 | s[7] >> 0x1d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  s[1] = s[1] ^ 0x556c6a81a7cc9ad0;
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x35 | s[0xf] >> 0xb);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x33 | s[10] >> 0xd);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 0x25 | s[9] >> 0x1b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 3 | s[0xc] >> 0x3d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x15 | s[0xb] >> 0x2b);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x13 | s[0xe] >> 0x2d);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 5 | s[0xd] >> 0x3b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 0x23 | s[8] >> 0x1d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  s[10] = s[10] ^ 0x2ab63540d3e64d68;
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x35 | s[0x16] >> 0xb);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x33 | s[0x13] >> 0xd);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 0x25 | s[0x10] >> 0x1b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 3 | s[0x15] >> 0x3d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x15 | s[0x12] >> 0x2b);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x13 | s[0x17] >> 0x2d);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 5 | s[0x14] >> 0x3b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 0x23 | s[0x11] >> 0x1d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  s[0x13] = s[0x13] ^ 0x155b1aa069f326b4;
  uVar1 = s[4];
  uVar2 = s[4];
  s[4] = s[0xc] ^ s[0x14] ^ s[4];
  uVar4 = s[0xc] ^ (s[4] << 0x35 | s[4] >> 0xb);
  s[0xc] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x14] = (s[0x14] << 0xe | s[0x14] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[0x14];
  uVar2 = s[4];
  uVar4 = s[4];
  uVar3 = s[0xc];
  s[4] = (s[0xc] | s[0x14] ^ 0xffffffffffffffff) ^ s[4];
  s[0xc] = (uVar2 | s[0x14]) ^ s[0xc];
  s[0x14] = uVar4 & uVar3 ^ s[0x14];
  uVar1 = s[5];
  uVar2 = s[5];
  s[5] = s[0xd] ^ s[0x15] ^ s[5];
  uVar4 = s[0xd] ^ (s[5] << 0x33 | s[5] >> 0xd);
  s[0xd] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x15] = (s[0x15] << 0x22 | s[0x15] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[0x15];
  uVar2 = s[5];
  uVar4 = s[5];
  uVar3 = s[0xd];
  s[5] = (s[0xd] | s[0x15] ^ 0xffffffffffffffff) ^ s[5];
  s[0xd] = (uVar2 | s[0x15]) ^ s[0xd];
  s[0x15] = uVar4 & uVar3 ^ s[0x15];
  uVar1 = s[6];
  uVar2 = s[6];
  s[6] = s[0xe] ^ s[0x16] ^ s[6];
  uVar4 = s[0xe] ^ (s[6] << 0x25 | s[6] >> 0x1b);
  s[0xe] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x16] = (s[0x16] << 0x2e | s[0x16] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0x16];
  uVar2 = s[6];
  uVar4 = s[6];
  uVar3 = s[0xe];
  s[6] = (s[0xe] | s[0x16] ^ 0xffffffffffffffff) ^ s[6];
  s[0xe] = (uVar2 | s[0x16]) ^ s[0xe];
  s[0x16] = uVar4 & uVar3 ^ s[0x16];
  uVar1 = s[7];
  uVar2 = s[7];
  s[7] = s[0xf] ^ s[0x17] ^ s[7];
  uVar4 = s[0xf] ^ (s[7] << 3 | s[7] >> 0x3d);
  s[0xf] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x17] = (s[0x17] << 2 | s[0x17] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[0x17];
  uVar2 = s[7];
  uVar4 = s[7];
  uVar3 = s[0xf];
  s[7] = (s[0xf] | s[0x17] ^ 0xffffffffffffffff) ^ s[7];
  s[0xf] = (uVar2 | s[0x17]) ^ s[0xf];
  s[0x17] = uVar4 & uVar3 ^ s[0x17];
  uVar1 = *s;
  uVar2 = *s;
  *s = s[8] ^ s[0x10] ^ *s;
  uVar4 = s[8] ^ (*s << 0x15 | *s >> 0x2b);
  s[8] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x10] = (s[0x10] << 0xe | s[0x10] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0x10];
  uVar2 = *s;
  uVar4 = *s;
  uVar3 = s[8];
  *s = (s[8] | s[0x10] ^ 0xffffffffffffffff) ^ *s;
  s[8] = (uVar2 | s[0x10]) ^ s[8];
  s[0x10] = uVar4 & uVar3 ^ s[0x10];
  uVar1 = s[1];
  uVar2 = s[1];
  s[1] = s[9] ^ s[0x11] ^ s[1];
  uVar4 = s[9] ^ (s[1] << 0x13 | s[1] >> 0x2d);
  s[9] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x11] = (s[0x11] << 0x22 | s[0x11] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0x11];
  uVar2 = s[1];
  uVar4 = s[1];
  uVar3 = s[9];
  s[1] = (s[9] | s[0x11] ^ 0xffffffffffffffff) ^ s[1];
  s[9] = (uVar2 | s[0x11]) ^ s[9];
  s[0x11] = uVar4 & uVar3 ^ s[0x11];
  uVar1 = s[2];
  uVar2 = s[2];
  s[2] = s[10] ^ s[0x12] ^ s[2];
  uVar4 = s[10] ^ (s[2] << 5 | s[2] >> 0x3b);
  s[10] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0x12] = (s[0x12] << 0x2e | s[0x12] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0x12];
  uVar2 = s[2];
  uVar4 = s[2];
  uVar3 = s[10];
  s[2] = (s[10] | s[0x12] ^ 0xffffffffffffffff) ^ s[2];
  s[10] = (uVar2 | s[0x12]) ^ s[10];
  s[0x12] = uVar4 & uVar3 ^ s[0x12];
  uVar1 = s[3];
  uVar2 = s[3];
  s[3] = s[0xb] ^ s[0x13] ^ s[3];
  uVar4 = s[0xb] ^ (s[3] << 0x23 | s[3] >> 0x1d);
  s[0xb] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0x13] = (s[0x13] << 2 | s[0x13] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0x13];
  uVar2 = s[3];
  uVar4 = s[3];
  uVar3 = s[0xb];
  s[3] = (s[0xb] | s[0x13] ^ 0xffffffffffffffff) ^ s[3];
  s[0xb] = (uVar2 | s[0x13]) ^ s[0xb];
  s[0x13] = uVar4 & uVar3 ^ s[0x13];
  s[5] = s[5] ^ 0xaad8d5034f9935a;
  uVar1 = s[0xb];
  uVar2 = s[0xb];
  s[0xb] = s[0x15] ^ s[2] ^ s[0xb];
  uVar4 = s[0x15] ^ (s[0xb] << 0x35 | s[0xb] >> 0xb);
  s[0x15] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[2] = (s[2] << 0xe | s[2] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[2];
  uVar2 = s[0xb];
  uVar4 = s[0xb];
  uVar3 = s[0x15];
  s[0xb] = (s[0x15] | s[2] ^ 0xffffffffffffffff) ^ s[0xb];
  s[0x15] = (uVar2 | s[2]) ^ s[0x15];
  s[2] = uVar4 & uVar3 ^ s[2];
  uVar1 = s[0xe];
  uVar2 = s[0xe];
  s[0xe] = s[0x14] ^ s[7] ^ s[0xe];
  uVar4 = s[0x14] ^ (s[0xe] << 0x33 | s[0xe] >> 0xd);
  s[0x14] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[7] = (s[7] << 0x22 | s[7] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[7];
  uVar2 = s[0xe];
  uVar4 = s[0xe];
  uVar3 = s[0x14];
  s[0xe] = (s[0x14] | s[7] ^ 0xffffffffffffffff) ^ s[0xe];
  s[0x14] = (uVar2 | s[7]) ^ s[0x14];
  s[7] = uVar4 & uVar3 ^ s[7];
  uVar1 = s[0xd];
  uVar2 = s[0xd];
  s[0xd] = s[0x17] ^ s[4] ^ s[0xd];
  uVar4 = s[0x17] ^ (s[0xd] << 0x25 | s[0xd] >> 0x1b);
  s[0x17] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[4] = (s[4] << 0x2e | s[4] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[4];
  uVar2 = s[0xd];
  uVar4 = s[0xd];
  uVar3 = s[0x17];
  s[0xd] = (s[0x17] | s[4] ^ 0xffffffffffffffff) ^ s[0xd];
  s[0x17] = (uVar2 | s[4]) ^ s[0x17];
  s[4] = uVar4 & uVar3 ^ s[4];
  uVar1 = s[8];
  uVar2 = s[8];
  s[8] = s[0x16] ^ s[1] ^ s[8];
  uVar4 = s[0x16] ^ (s[8] << 3 | s[8] >> 0x3d);
  s[0x16] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[1] = (s[1] << 2 | s[1] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[1];
  uVar2 = s[8];
  uVar4 = s[8];
  uVar3 = s[0x16];
  s[8] = (s[0x16] | s[1] ^ 0xffffffffffffffff) ^ s[8];
  s[0x16] = (uVar2 | s[1]) ^ s[0x16];
  s[1] = uVar4 & uVar3 ^ s[1];
  uVar1 = s[0xf];
  uVar2 = s[0xf];
  s[0xf] = s[0x11] ^ s[6] ^ s[0xf];
  uVar4 = s[0x11] ^ (s[0xf] << 0x15 | s[0xf] >> 0x2b);
  s[0x11] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[6] = (s[6] << 0xe | s[6] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[6];
  uVar2 = s[0xf];
  uVar4 = s[0xf];
  uVar3 = s[0x11];
  s[0xf] = (s[0x11] | s[6] ^ 0xffffffffffffffff) ^ s[0xf];
  s[0x11] = (uVar2 | s[6]) ^ s[0x11];
  s[6] = uVar4 & uVar3 ^ s[6];
  uVar1 = s[10];
  uVar2 = s[10];
  s[10] = s[0x10] ^ s[3] ^ s[10];
  uVar4 = s[0x10] ^ (s[10] << 0x13 | s[10] >> 0x2d);
  s[0x10] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[3] = (s[3] << 0x22 | s[3] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[3];
  uVar2 = s[10];
  uVar4 = s[10];
  uVar3 = s[0x10];
  s[10] = (s[0x10] | s[3] ^ 0xffffffffffffffff) ^ s[10];
  s[0x10] = (uVar2 | s[3]) ^ s[0x10];
  s[3] = uVar4 & uVar3 ^ s[3];
  uVar1 = s[9];
  uVar2 = s[9];
  s[9] = s[0x13] ^ *s ^ s[9];
  uVar4 = s[0x13] ^ (s[9] << 5 | s[9] >> 0x3b);
  s[0x13] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  *s = (*s << 0x2e | *s >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ *s;
  uVar2 = s[9];
  uVar4 = s[9];
  uVar3 = s[0x13];
  s[9] = (s[0x13] | *s ^ 0xffffffffffffffff) ^ s[9];
  s[0x13] = (uVar2 | *s) ^ s[0x13];
  *s = uVar4 & uVar3 ^ *s;
  uVar1 = s[0xc];
  uVar2 = s[0xc];
  s[0xc] = s[0x12] ^ s[5] ^ s[0xc];
  uVar4 = s[0x12] ^ (s[0xc] << 0x23 | s[0xc] >> 0x1d);
  s[0x12] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[5] = (s[5] << 2 | s[5] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[5];
  uVar2 = s[0xc];
  uVar4 = s[0xc];
  uVar3 = s[0x12];
  s[0xc] = (s[0x12] | s[5] ^ 0xffffffffffffffff) ^ s[0xc];
  s[0x12] = (uVar2 | s[5]) ^ s[0x12];
  s[5] = uVar4 & uVar3 ^ s[5];
  s[0xe] = s[0xe] ^ 0x556c6a81a7cc9ad;
  uVar1 = s[0x12];
  uVar2 = s[0x12];
  s[0x12] = s[7] ^ s[9] ^ s[0x12];
  uVar4 = s[7] ^ (s[0x12] << 0x35 | s[0x12] >> 0xb);
  s[7] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[9] = (s[9] << 0xe | s[9] >> 0x32) ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ s[9];
  uVar2 = s[0x12];
  uVar4 = s[0x12];
  uVar3 = s[7];
  s[0x12] = (s[7] | s[9] ^ 0xffffffffffffffff) ^ s[0x12];
  s[7] = (uVar2 | s[9]) ^ s[7];
  s[9] = uVar4 & uVar3 ^ s[9];
  uVar1 = s[0x17];
  uVar2 = s[0x17];
  s[0x17] = s[2] ^ s[8] ^ s[0x17];
  uVar4 = s[2] ^ (s[0x17] << 0x33 | s[0x17] >> 0xd);
  s[2] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[8] = (s[8] << 0x22 | s[8] >> 0x1e) ^ (uVar4 << 7 | uVar4 >> 0x39) ^ s[8];
  uVar2 = s[0x17];
  uVar4 = s[0x17];
  uVar3 = s[2];
  s[0x17] = (s[2] | s[8] ^ 0xffffffffffffffff) ^ s[0x17];
  s[2] = (uVar2 | s[8]) ^ s[2];
  s[8] = uVar4 & uVar3 ^ s[8];
  uVar1 = s[0x14];
  uVar2 = s[0x14];
  s[0x14] = s[1] ^ s[0xb] ^ s[0x14];
  uVar4 = s[1] ^ (s[0x14] << 0x25 | s[0x14] >> 0x1b);
  s[1] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xb] = (s[0xb] << 0x2e | s[0xb] >> 0x12) ^ (uVar4 << 0x31 | uVar4 >> 0xf) ^ s[0xb];
  uVar2 = s[0x14];
  uVar4 = s[0x14];
  uVar3 = s[1];
  s[0x14] = (s[1] | s[0xb] ^ 0xffffffffffffffff) ^ s[0x14];
  s[1] = (uVar2 | s[0xb]) ^ s[1];
  s[0xb] = uVar4 & uVar3 ^ s[0xb];
  uVar1 = s[0x11];
  uVar2 = s[0x11];
  s[0x11] = s[4] ^ s[10] ^ s[0x11];
  uVar4 = s[4] ^ (s[0x11] << 3 | s[0x11] >> 0x3d);
  s[4] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[10] = (s[10] << 2 | s[10] >> 0x3e) ^ (uVar4 << 0x17 | uVar4 >> 0x29) ^ s[10];
  uVar2 = s[0x11];
  uVar4 = s[0x11];
  uVar3 = s[4];
  s[0x11] = (s[4] | s[10] ^ 0xffffffffffffffff) ^ s[0x11];
  s[4] = (uVar2 | s[10]) ^ s[4];
  s[10] = uVar4 & uVar3 ^ s[10];
  uVar1 = s[0x16];
  uVar2 = s[0x16];
  s[0x16] = s[3] ^ s[0xd] ^ s[0x16];
  uVar4 = s[3] ^ (s[0x16] << 0x15 | s[0x16] >> 0x2b);
  s[3] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xd] = (s[0xd] << 0xe | s[0xd] >> 0x32) ^ (uVar4 << 0x21 | uVar4 >> 0x1f) ^ s[0xd];
  uVar2 = s[0x16];
  uVar4 = s[0x16];
  uVar3 = s[3];
  s[0x16] = (s[3] | s[0xd] ^ 0xffffffffffffffff) ^ s[0x16];
  s[3] = (uVar2 | s[0xd]) ^ s[3];
  s[0xd] = uVar4 & uVar3 ^ s[0xd];
  uVar1 = s[0x13];
  uVar2 = s[0x13];
  s[0x13] = s[6] ^ s[0xc] ^ s[0x13];
  uVar4 = s[6] ^ (s[0x13] << 0x13 | s[0x13] >> 0x2d);
  s[6] = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xc] = (s[0xc] << 0x22 | s[0xc] >> 0x1e) ^ (uVar4 << 0x27 | uVar4 >> 0x19) ^ s[0xc];
  uVar2 = s[0x13];
  uVar4 = s[0x13];
  uVar3 = s[6];
  s[0x13] = (s[6] | s[0xc] ^ 0xffffffffffffffff) ^ s[0x13];
  s[6] = (uVar2 | s[0xc]) ^ s[6];
  s[0xc] = uVar4 & uVar3 ^ s[0xc];
  uVar1 = s[0x10];
  uVar2 = s[0x10];
  s[0x10] = s[5] ^ s[0xf] ^ s[0x10];
  uVar4 = s[5] ^ (s[0x10] << 5 | s[0x10] >> 0x3b);
  s[5] = uVar4 ^ (uVar1 << 8 | uVar2 >> 0x38);
  s[0xf] = (s[0xf] << 0x2e | s[0xf] >> 0x12) ^ (uVar4 << 0x11 | uVar4 >> 0x2f) ^ s[0xf];
  uVar2 = s[0x10];
  uVar4 = s[0x10];
  uVar3 = s[5];
  s[0x10] = (s[5] | s[0xf] ^ 0xffffffffffffffff) ^ s[0x10];
  s[5] = (uVar2 | s[0xf]) ^ s[5];
  s[0xf] = uVar4 & uVar3 ^ s[0xf];
  uVar1 = s[0x15];
  uVar2 = s[0x15];
  s[0x15] = *s ^ s[0xe] ^ s[0x15];
  uVar4 = *s ^ (s[0x15] << 0x23 | s[0x15] >> 0x1d);
  *s = uVar4 ^ (uVar1 << 0x38 | uVar2 >> 8);
  s[0xe] = (s[0xe] << 2 | s[0xe] >> 0x3e) ^ (uVar4 << 0x37 | uVar4 >> 9) ^ s[0xe];
  uVar2 = s[0x15];
  uVar4 = s[0x15];
  uVar3 = *s;
  s[0x15] = (*s | s[0xe] ^ 0xffffffffffffffff) ^ s[0x15];
  *s = (uVar2 | s[0xe]) ^ *s;
  s[0xe] = uVar4 & uVar3 ^ s[0xe];
  s[0x17] = s[0x17] ^ 0xde8082cd72debc78;
  return;
}

Assistant:

static void bashF0(u64 s[24])
{
	register u64 t0;
	register u64 t1;
	register u64 t2;
	bashR(s, P0, P1,  1, t0, t1, t2);
	bashR(s, P1, P2,  2, t0, t1, t2);
	bashR(s, P2, P3,  3, t0, t1, t2);
	bashR(s, P3, P4,  4, t0, t1, t2);
	bashR(s, P4, P5,  5, t0, t1, t2);
	bashR(s, P5, P0,  6, t0, t1, t2);
	bashR(s, P0, P1,  7, t0, t1, t2);
	bashR(s, P1, P2,  8, t0, t1, t2);
	bashR(s, P2, P3,  9, t0, t1, t2);
	bashR(s, P3, P4, 10, t0, t1, t2);
	bashR(s, P4, P5, 11, t0, t1, t2);
	bashR(s, P5, P0, 12, t0, t1, t2);
	bashR(s, P0, P1, 13, t0, t1, t2);
	bashR(s, P1, P2, 14, t0, t1, t2);
	bashR(s, P2, P3, 15, t0, t1, t2);
	bashR(s, P3, P4, 16, t0, t1, t2);
	bashR(s, P4, P5, 17, t0, t1, t2);
	bashR(s, P5, P0, 18, t0, t1, t2);
	bashR(s, P0, P1, 19, t0, t1, t2);
	bashR(s, P1, P2, 20, t0, t1, t2);
	bashR(s, P2, P3, 21, t0, t1, t2);
	bashR(s, P3, P4, 22, t0, t1, t2);
	bashR(s, P4, P5, 23, t0, t1, t2);
	bashR(s, P5, P0, 24, t0, t1, t2);
	t0 = t1 = t2 = 0;
}